

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  TestCaseInfo *other_local;
  TestCaseInfo *this_local;
  
  Ptr<Catch::ITestCase>::Ptr(&this->m_test,&other->m_test);
  std::__cxx11::string::string((string *)&this->m_className,(string *)&other->m_className);
  std::__cxx11::string::string((string *)&this->m_name,(string *)&other->m_name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)&other->m_description);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_tags,&other->m_tags);
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,&other->m_lineInfo);
  this->m_isHidden = (bool)(other->m_isHidden & 1);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( const TestCaseInfo& other )
    :   m_test( other.m_test ),
        m_className( other.m_className ),
        m_name( other.m_name ),
        m_description( other.m_description ),
        m_tags( other.m_tags ),
        m_lineInfo( other.m_lineInfo ),
        m_isHidden( other.m_isHidden )
    {}